

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

void icetSparseImageSetDimensions(IceTSparseImage image,IceTSizeType width,IceTSizeType height)

{
  if (image.opaque_internals == (IceTVoid *)0x0) {
    icetRaiseDiagnostic("Cannot set number of pixels on null image.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x25a);
    return;
  }
  if (*(int *)((long)image.opaque_internals + 0x14) < height * width) {
    icetRaiseDiagnostic("Cannot set an image size to greater than what the image was originally created."
                        ,0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x261);
    return;
  }
  *(IceTSizeType *)((long)image.opaque_internals + 0xc) = width;
  *(IceTSizeType *)((long)image.opaque_internals + 0x10) = height;
  *(IceTSizeType *)((long)image.opaque_internals + 0x1c) = height * width;
  *(undefined4 *)((long)image.opaque_internals + 0x20) = 0;
  *(undefined4 *)((long)image.opaque_internals + 0x18) = 0x24;
  return;
}

Assistant:

void icetSparseImageSetDimensions(IceTSparseImage image,
                                  IceTSizeType width,
                                  IceTSizeType height)
{
    ICET_TEST_SPARSE_IMAGE_HEADER(image);

    if (image.opaque_internals == NULL) {
        icetRaiseError("Cannot set number of pixels on null image.",
                       ICET_INVALID_VALUE);
        return;
    }

    if (   width*height
         > ICET_IMAGE_HEADER(image)[ICET_IMAGE_MAX_NUM_PIXELS_INDEX] ){
        icetRaiseError("Cannot set an image size to greater than what the"
                       " image was originally created.", ICET_INVALID_VALUE);
        return;
    }

    ICET_IMAGE_HEADER(image)[ICET_IMAGE_WIDTH_INDEX] = (IceTInt)width;
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_HEIGHT_INDEX] = (IceTInt)height;

  /* Make sure the runlengths are valid. */
    icetClearSparseImage(image);
}